

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

idx_t duckdb::Bit::ComputeBitstringLen(idx_t len)

{
  return ((len >> 3) - (ulong)((len & 7) == 0)) + 2;
}

Assistant:

idx_t Bit::ComputeBitstringLen(idx_t len) {
	idx_t result = len / 8;
	if (len % 8 != 0) {
		result++;
	}
	// additional first byte to store info on zero padding
	result++;
	return result;
}